

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_opt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  float *gray_image;
  integral_image *iimage;
  fasthessian *fh;
  long lVar2;
  int height;
  int width;
  vector<interest_point,_std::allocator<interest_point>_> interest_points;
  int channels;
  int local_40;
  int local_3c;
  vector<interest_point,_std::allocator<interest_point>_> local_38;
  int local_1c;
  
  if (argc == 3) {
    stbi__l2h_gamma = 1.0;
    gray_image = stbi_loadf(argv[1],&local_3c,&local_40,&local_1c,1);
    if (gray_image == (float *)0x0) {
      puts("Could not open or find image");
      iVar1 = -1;
    }
    else {
      iimage = create_integral_img(local_3c,local_40);
      compute_integral_img(gray_image,iimage);
      fh = create_fast_hessian(iimage);
      create_response_map(fh);
      compute_response_layers(fh);
      local_38.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<interest_point,_std::allocator<interest_point>_>::reserve(&local_38,1000);
      get_interest_points(fh,&local_38);
      get_msurf_descriptors_rounding_unroll_2_24_True_winner(iimage,&local_38);
      free(gray_image);
      free(iimage->padded_data);
      free(iimage);
      lVar2 = 1;
      do {
        free(fh->response_map[lVar2 + -1]->response);
        free(fh->response_map[lVar2 + -1]->laplacian);
        free(fh->response_map[lVar2 + -1]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 5);
      free(fh);
      free(*(void **)(haarResponseX + -2));
      free(*(void **)(haarResponseY + -2));
      if (local_38.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<interest_point,_std::allocator<interest_point>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar1 = 0;
    }
  }
  else {
    puts("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char const *argv[])
{
    if (argc != 3) {
        printf("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path\n");
        return 1;
    }
    int width, height, channels;

    // Load image
    stbi_ldr_to_hdr_gamma(1.0f);
    float* image = stbi_loadf(argv[1], &width, &height, &channels, STBI_grey);

    if (!image) {
        printf("Could not open or find image\n");
        return -1;
    }

    // Create integral image
    struct integral_image* iimage = create_integral_img(width, height);
    // Compute integral image
    compute_integral_img(image, iimage);

    // Fast-Hessian
    struct fasthessian* fh = create_fast_hessian(iimage);

    // Create octaves with response layers
    create_response_map(fh);

	// Compute responses for every layer
	compute_response_layers(fh);

    // Getting interest points with non-maximum supression
    std::vector<struct interest_point> interest_points;
    interest_points.reserve(1000);
    
    get_interest_points(fh, &interest_points);

    // Getting M-SURF descriptors for each interest point
	get_msurf_descriptors_rounding_unroll_2_24_True_winner(iimage, &interest_points);


    // skipping this part as it adds nise for profiler
    /*
    // Write results to file
    FILE * fp = fopen(argv[2],"w");
    printf("%d %d %d\n", iimage->width, iimage->height, channels);
    for (size_t i=0; i<interest_points.size(); ++i) {
        fprintf(fp, "%f %f %f %d ", interest_points[i].x, interest_points[i].y, interest_points[i].scale, interest_points[i].laplacian);
        for(size_t j = 0; j < 64; j++) {
            fprintf(fp, "%f ", interest_points[i].descriptor[j]);
        }
        fprintf(fp, "\n");
    }
    fclose(fp);
    */

    // Free memory
    stbi_image_free(image); // possibly move this to create_integral_img
    free(iimage->padded_data);
    free(iimage);
    for (int i = 0; i < NUM_LAYERS; ++i) {
        free(fh->response_map[i]->response);
		free(fh->response_map[i]->laplacian);
        free(fh->response_map[i]);
    }
    free(fh);

    extern float* haarResponseX;
    extern float* haarResponseY;

    aligned_free(haarResponseX);
    aligned_free(haarResponseY);

    return 0;
}